

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::Relation::ExecuteOrThrow(Relation *this)

{
  pointer pQVar1;
  allocator local_31;
  string local_30;
  
  Execute(this);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)this);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
           (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
  }
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)this);
  ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_3b2a81b + 9,&local_31);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,&local_30);
}

Assistant:

unique_ptr<QueryResult> Relation::ExecuteOrThrow() {
	auto res = Execute();
	D_ASSERT(res);
	if (res->HasError()) {
		res->ThrowError();
	}
	return res;
}